

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_ffql_df_mips64(CPUMIPSState_conflict5 *env,uint32_t df,uint32_t wd,uint32_t ws)

{
  float_status *pfVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  float32 fVar5;
  float64 fVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  float_status *status;
  wr_t wx;
  float64 local_40 [2];
  
  if (df == 2) {
    pfVar1 = &(env->active_tc).msa_fp_status;
    lVar8 = 0;
    do {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar5 = int32_to_float32_mips64
                        ((int)*(short *)((long)(env->active_fpu).fpr +
                                        lVar8 * 2 + (ulong)ws * 0x10 + 8),pfVar1);
      fVar5 = float32_scalbn_mips64(fVar5,-0xf,pfVar1);
      *(float32 *)((long)local_40 + lVar8 * 4) = fVar5;
      bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
      uVar11 = (uint)bVar2;
      if ((fVar5 & 0x7f800000) == 0) {
        uVar11 = uVar11 | 0x10;
      }
      if ((fVar5 & 0x7fffffff) == 0) {
        uVar11 = (uint)bVar2;
      }
      uVar3 = ieee_ex_to_mips_mips64(uVar11);
      uVar7 = (env->active_tc).msacsr;
      uVar10 = (uVar7 & 0x1000000) >> 0x18 & uVar11 >> 6;
      uVar9 = 3;
      if ((uVar7 & 0x1000000) == 0) {
        uVar9 = uVar10;
      }
      if (uVar11 < 0x80) {
        uVar9 = uVar10;
      }
      uVar9 = uVar9 | uVar3;
      uVar4 = (uint)((uVar7 >> 9 & 1) == 0 & (byte)uVar3 >> 2);
      uVar10 = uVar4 | uVar9;
      uVar11 = uVar3 & 0xfffffffc;
      if ((uVar4 != 0 || (uVar9 & 1) != 0) || (uVar7 & 0x100) != 0) {
        uVar11 = uVar10;
      }
      if ((uVar9 & 2) == 0) {
        uVar11 = uVar10;
      }
      if ((uVar11 & (uVar7 >> 7 & 0x1f | 0x20)) == 0) {
        uVar9 = uVar11 << 0xc;
LAB_008d4645:
        (env->active_tc).msacsr = uVar9 & 0x3f000 | uVar7;
      }
      else if ((uVar7 >> 0x12 & 1) == 0) {
        uVar9 = uVar11 << 0xc | uVar7;
        uVar7 = uVar7 & 0xfff80fff;
        goto LAB_008d4645;
      }
      if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar11) != 0) {
        fVar5 = float32_default_nan_mips64(pfVar1);
        *(float32 *)((long)local_40 + lVar8 * 4) = fVar5 & 0xffffffc0 ^ 0x400000 | uVar11;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
  }
  else {
    if (df != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                    ,0x1c5f,
                    "void helper_msa_ffql_df_mips64(CPUMIPSState *, uint32_t, uint32_t, uint32_t)");
    }
    pfVar1 = &(env->active_tc).msa_fp_status;
    lVar8 = 0;
    do {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar6 = int32_to_float64_mips64
                        (*(int32_t *)
                          ((long)(env->active_fpu).fpr + lVar8 * 4 + (ulong)ws * 0x10 + 8),pfVar1);
      fVar6 = float64_scalbn_mips64(fVar6,-0x1f,pfVar1);
      local_40[lVar8] = fVar6;
      bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
      uVar11 = (uint)bVar2;
      if ((fVar6 & 0x7ff0000000000000) == 0) {
        uVar11 = uVar11 | 0x10;
      }
      if ((fVar6 & 0x7fffffffffffffff) == 0) {
        uVar11 = (uint)bVar2;
      }
      uVar3 = ieee_ex_to_mips_mips64(uVar11);
      uVar7 = (env->active_tc).msacsr;
      uVar10 = (uVar7 & 0x1000000) >> 0x18 & uVar11 >> 6;
      uVar9 = 3;
      if ((uVar7 & 0x1000000) == 0) {
        uVar9 = uVar10;
      }
      if (uVar11 < 0x80) {
        uVar9 = uVar10;
      }
      uVar9 = uVar9 | uVar3;
      uVar4 = (uint)((uVar7 >> 9 & 1) == 0 & (byte)uVar3 >> 2);
      uVar10 = uVar4 | uVar9;
      uVar11 = uVar3 & 0xfffffffc;
      if ((uVar4 != 0 || (uVar9 & 1) != 0) || (uVar7 & 0x100) != 0) {
        uVar11 = uVar10;
      }
      if ((uVar9 & 2) == 0) {
        uVar11 = uVar10;
      }
      if ((uVar11 & (uVar7 >> 7 & 0x1f | 0x20)) == 0) {
        uVar9 = uVar11 << 0xc;
LAB_008d44f2:
        (env->active_tc).msacsr = uVar9 & 0x3f000 | uVar7;
      }
      else if ((uVar7 >> 0x12 & 1) == 0) {
        uVar9 = uVar11 << 0xc | uVar7;
        uVar7 = uVar7 & 0xfff80fff;
        goto LAB_008d44f2;
      }
      if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar11) != 0) {
        fVar6 = float64_default_nan_mips64(pfVar1);
        local_40[lVar8] = (long)(int)uVar11 | fVar6 & 0xffffffffffffffc0 ^ 0x8000000000000;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 == 1);
  }
  (env->active_fpu).fpr[wd].fd = local_40[0];
  *(float64 *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = local_40[1];
  return;
}

Assistant:

void helper_msa_ffql_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
                        uint32_t ws)
{
    wr_t wx, *pwx = &wx;
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    uint32_t i;

    switch (df) {
    case DF_WORD:
        for (i = 0; i < DF_ELEMENTS(DF_WORD); i++) {
            MSA_FLOAT_UNOP(pwx->w[i], from_q16, Lh(pws, i), 32);
        }
        break;
    case DF_DOUBLE:
        for (i = 0; i < DF_ELEMENTS(DF_DOUBLE); i++) {
            MSA_FLOAT_UNOP(pwx->d[i], from_q32, Lw(pws, i), 64);
        }
        break;
    default:
        assert(0);
    }

    msa_move_v(pwd, pwx);
}